

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int ParseEXRMultipartHeaderFromMemory
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,uchar *memory,
              size_t size,char **err)

{
  long lVar1;
  bool bVar2;
  undefined4 in_EAX;
  int iVar3;
  EXRHeader **ppEVar4;
  ulong uVar5;
  EXRHeader *exr_header;
  pointer pHVar6;
  long lVar7;
  uchar *buf;
  size_t i;
  pointer pHVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  bool empty_header;
  allocator local_179;
  EXRHeader ***local_178;
  string err_str;
  vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> infos;
  HeaderInfo info;
  string local_50;
  
  auVar10._0_4_ = -(uint)(exr_headers == (EXRHeader ***)0x0);
  auVar10._4_4_ = -(uint)(memory == (uchar *)0x0);
  auVar10._8_4_ = -(uint)(num_headers == (int *)0x0);
  auVar10._12_4_ = -(uint)(exr_version == (EXRVersion *)0x0);
  iVar3 = movmskps(in_EAX,auVar10);
  if (iVar3 == 0) {
    if (size < 8) {
      std::__cxx11::string::string((string *)&info,"Data size too short",(allocator *)&err_str);
      tinyexr::SetErrorMessage((string *)&info,err);
      std::__cxx11::string::~string((string *)&info);
      iVar3 = -4;
    }
    else {
      buf = memory + 8;
      infos.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      infos.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      infos.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_178 = exr_headers;
      while( true ) {
        info.attributes.super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        info.attributes.super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        info.channels.
        super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        info.attributes.super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        info.channels.
        super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        info.channels.
        super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        info.name._M_dataplus._M_p = (pointer)&info.name.field_2;
        info.name._M_string_length = 0;
        info.name.field_2._M_local_buf[0] = '\0';
        info.type._M_dataplus._M_p = (pointer)&info.type.field_2;
        info.type._M_string_length = 0;
        info.type.field_2._M_local_buf[0] = '\0';
        tinyexr::HeaderInfo::clear(&info);
        err_str._M_dataplus._M_p = (pointer)&err_str.field_2;
        err_str._M_string_length = 0;
        err_str.field_2._M_local_buf[0] = '\0';
        empty_header = false;
        iVar3 = tinyexr::ParseEXRHeader(&info,&empty_header,exr_version,&err_str,buf,size - 8);
        if (iVar3 != 0) break;
        if (empty_header != false) {
          std::__cxx11::string::~string((string *)&err_str);
          tinyexr::HeaderInfo::~HeaderInfo(&info);
          pHVar8 = infos.
                   super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pHVar6 = infos.
                   super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          ppEVar4 = (EXRHeader **)
                    malloc((((long)infos.
                                   super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)infos.
                                  super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 200) * 8);
          *local_178 = ppEVar4;
          iVar3 = 0;
          for (uVar9 = 0; uVar5 = ((long)pHVar8 - (long)pHVar6) / 200, uVar9 < uVar5;
              uVar9 = uVar9 + 1) {
            exr_header = (EXRHeader *)calloc(1,0x188);
            info.channels.
            super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)&info.channels.
                           super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            info.channels.
            super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            err_str._M_dataplus._M_p = (pointer)&err_str.field_2;
            err_str._M_string_length = 0;
            info.channels.
            super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)((ulong)info.channels.
                                  super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage &
                          0xffffffffffffff00);
            err_str.field_2._M_local_buf[0] = '\0';
            bVar2 = tinyexr::ConvertHeader(exr_header,pHVar6 + uVar9,(string *)&info,&err_str);
            if (!bVar2) {
              for (lVar7 = uVar9 * 200 + 0x20;
                  lVar1 = *(long *)((long)(infos.
                                           super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                          screen_window_center + lVar7 + -0x5c),
                  *(long *)((long)(infos.
                                   super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->screen_window_center
                           + lVar7 + -0x54) != lVar1; lVar7 = lVar7 + 200) {
                free(*(void **)(lVar1 + 0x200));
                uVar9 = uVar9 + 1;
              }
              if (err_str._M_string_length != 0) {
                tinyexr::SetErrorMessage(&err_str,err);
              }
              iVar3 = -9;
            }
            exr_header->multipart = (uint)(exr_version->multipart != 0);
            (*local_178)[uVar9] = exr_header;
            std::__cxx11::string::~string((string *)&err_str);
            std::__cxx11::string::~string((string *)&info);
            pHVar6 = infos.
                     super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pHVar8 = infos.
                     super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          }
          *num_headers = (int)uVar5;
          goto LAB_001ab4ae;
        }
        if (info.chunk_count == 0) {
          lVar7 = 0x200;
          for (uVar9 = 0;
              uVar9 < (ulong)(((long)info.attributes.
                                     super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)info.attributes.
                                    super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x210);
              uVar9 = uVar9 + 1) {
            free(*(void **)((info.attributes.
                             super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>.
                             _M_impl.super__Vector_impl_data._M_start)->name + lVar7));
            lVar7 = lVar7 + 0x210;
          }
          std::__cxx11::string::string
                    ((string *)&local_50,"`chunkCount\' attribute is not found in the header.",
                     &local_179);
          tinyexr::SetErrorMessage(&local_50,err);
          std::__cxx11::string::~string((string *)&local_50);
          iVar3 = -4;
          goto LAB_001ab49a;
        }
        std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::push_back
                  (&infos,&info);
        buf = buf + info.header_len;
        std::__cxx11::string::~string((string *)&err_str);
        tinyexr::HeaderInfo::~HeaderInfo(&info);
      }
      lVar7 = 0x200;
      for (uVar9 = 0;
          uVar9 < (ulong)(((long)info.attributes.
                                 super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)info.attributes.
                                super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>.
                                _M_impl.super__Vector_impl_data._M_start) / 0x210);
          uVar9 = uVar9 + 1) {
        free(*(void **)((info.attributes.
                         super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
                         super__Vector_impl_data._M_start)->name + lVar7));
        lVar7 = lVar7 + 0x210;
      }
      tinyexr::SetErrorMessage(&err_str,err);
LAB_001ab49a:
      std::__cxx11::string::~string((string *)&err_str);
      tinyexr::HeaderInfo::~HeaderInfo(&info);
LAB_001ab4ae:
      std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::~vector(&infos);
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)&info,"Invalid argument for ParseEXRMultipartHeaderFromMemory",
               (allocator *)&err_str);
    tinyexr::SetErrorMessage((string *)&info,err);
    std::__cxx11::string::~string((string *)&info);
    iVar3 = -3;
  }
  return iVar3;
}

Assistant:

int ParseEXRMultipartHeaderFromMemory(EXRHeader ***exr_headers,
                                      int *num_headers,
                                      const EXRVersion *exr_version,
                                      const unsigned char *memory, size_t size,
                                      const char **err) {
  if (memory == NULL || exr_headers == NULL || num_headers == NULL ||
      exr_version == NULL) {
    // Invalid argument
    tinyexr::SetErrorMessage(
        "Invalid argument for ParseEXRMultipartHeaderFromMemory", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (size < tinyexr::kEXRVersionSize) {
    tinyexr::SetErrorMessage("Data size too short", err);
    return TINYEXR_ERROR_INVALID_DATA;
  }

  const unsigned char *marker = memory + tinyexr::kEXRVersionSize;
  size_t marker_size = size - tinyexr::kEXRVersionSize;

  std::vector<tinyexr::HeaderInfo> infos;

  for (;;) {
    tinyexr::HeaderInfo info;
    info.clear();

    std::string err_str;
    bool empty_header = false;
    int ret = ParseEXRHeader(&info, &empty_header, exr_version, &err_str,
                             marker, marker_size);

    if (ret != TINYEXR_SUCCESS) {

      // Free malloc-allocated memory here.
      for (size_t i = 0; i < info.attributes.size(); i++) {
        if (info.attributes[i].value) {
          free(info.attributes[i].value);
        }
      }

      tinyexr::SetErrorMessage(err_str, err);
      return ret;
    }

    if (empty_header) {
      marker += 1;  // skip '\0'
      break;
    }

    // `chunkCount` must exist in the header.
    if (info.chunk_count == 0) {

      // Free malloc-allocated memory here.
      for (size_t i = 0; i < info.attributes.size(); i++) {
        if (info.attributes[i].value) {
          free(info.attributes[i].value);
        }
      }

      tinyexr::SetErrorMessage(
          "`chunkCount' attribute is not found in the header.", err);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    infos.push_back(info);

    // move to next header.
    marker += info.header_len;
    size -= info.header_len;
  }

  // allocate memory for EXRHeader and create array of EXRHeader pointers.
  (*exr_headers) =
      static_cast<EXRHeader **>(malloc(sizeof(EXRHeader *) * infos.size()));

  
  int retcode = TINYEXR_SUCCESS;

  for (size_t i = 0; i < infos.size(); i++) {
    EXRHeader *exr_header = static_cast<EXRHeader *>(malloc(sizeof(EXRHeader)));
    memset(exr_header, 0, sizeof(EXRHeader));

    std::string warn;
    std::string _err;
    if (!ConvertHeader(exr_header, infos[i], &warn, &_err)) {

      // Free malloc-allocated memory here.
      for (size_t k = 0; k < infos[i].attributes.size(); i++) {
        if (infos[i].attributes[k].value) {
          free(infos[i].attributes[k].value);
        }
      }

      if (!_err.empty()) {
        tinyexr::SetErrorMessage(
            _err, err);
      }
      // continue to converting headers
      retcode = TINYEXR_ERROR_INVALID_HEADER;
    }

    exr_header->multipart = exr_version->multipart ? 1 : 0;

    (*exr_headers)[i] = exr_header;
  }

  (*num_headers) = static_cast<int>(infos.size());

  return retcode;
}